

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

ParseTokenKind __thiscall
TTD::TextFormatReader::Scan
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  ParseTokenKind PVar2;
  char16 local_22;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLStack_20;
  char16 c;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *charList_local;
  TextFormatReader *this_local;
  
  local_22 = L'\0';
  pLStack_20 = charList;
  charList_local =
       (List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)this;
  JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Clear
            (charList);
  while (bVar1 = FileReader::ReadRawChar(&this->super_FileReader,&local_22), bVar1) {
    switch(local_22) {
    case L'\0':
      return Error;
    default:
      PVar2 = ScanNakedString(this,local_22);
      return PVar2;
    case L'\t':
    case L'\n':
    case L'\r':
    case L' ':
      break;
    case L'!':
      PVar2 = ScanLogTag(this,pLStack_20);
      return PVar2;
    case L'#':
      PVar2 = ScanSpecialNumber(this);
      return PVar2;
    case L'$':
      PVar2 = ScanEnumTag(this,pLStack_20);
      return PVar2;
    case L'*':
      PVar2 = ScanAddress(this,pLStack_20);
      return PVar2;
    case L'+':
    case L'-':
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
      JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      Add(pLStack_20,&local_22);
      PVar2 = ScanNumber(this,pLStack_20);
      return PVar2;
    case L',':
      return Comma;
    case L':':
      return Colon;
    case L'@':
      PVar2 = ScanString(this,pLStack_20);
      return PVar2;
    case L'[':
      return LBrack;
    case L']':
      return RBrack;
    case L'{':
      return LCurly;
    case L'}':
      return RCurly;
    case L'~':
      PVar2 = ScanWellKnownToken(this,pLStack_20);
      return PVar2;
    }
  }
  return Error;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::Scan(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        charList.Clear();

        while(this->ReadRawChar(&c))
        {
            switch(c)
            {
            case 0:
                return NSTokens::ParseTokenKind::Error; //we shouldn't hit EOF explicitly here
            case _u('\t'):
            case _u('\r'):
            case _u('\n'):
            case _u(' '):
                //WS - keep looping
                break;
            case _u(','):
                return NSTokens::ParseTokenKind::Comma;
            case _u(':'):
                return NSTokens::ParseTokenKind::Colon;
            case _u('['):
                return NSTokens::ParseTokenKind::LBrack;
            case _u(']'):
                return NSTokens::ParseTokenKind::RBrack;
            case _u('{'):
                return NSTokens::ParseTokenKind::LCurly;
            case _u('}'):
                return NSTokens::ParseTokenKind::RCurly;
            case _u('#'):
                //# starts special double/number value representation
                return this->ScanSpecialNumber();
            case _u('-'):
            case _u('+'):
            case _u('0'):
            case _u('1'):
            case _u('2'):
            case _u('3'):
            case _u('4'):
            case _u('5'):
            case _u('6'):
            case _u('7'):
            case _u('8'):
            case _u('9'):
                //decimal digit or (-,+) starts a number
                charList.Add(c);
                return this->ScanNumber(charList);
            case _u('*'):
                //address
                return this->ScanAddress(charList);
            case _u('!'):
                //log tag
                return this->ScanLogTag(charList);
            case _u('$'):
                //enumeration value tag
                return this->ScanEnumTag(charList);
            case _u('~'):
                //wellknown token
                return this->ScanWellKnownToken(charList);
            case _u('@'):
                //string
                return this->ScanString(charList);
            default:
                //it is a naked literal value (or an error)
                return this->ScanNakedString(c);
            }
        }

        return NSTokens::ParseTokenKind::Error;
    }